

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh_factories.cpp
# Opt level: O2

tuple<std::unique_ptr<geometrycentral::surface::SurfaceMesh,_std::default_delete<geometrycentral::surface::SurfaceMesh>_>,_std::unique_ptr<geometrycentral::surface::VertexPositionGeometry,_std::default_delete<geometrycentral::surface::VertexPositionGeometry>_>,_std::unique_ptr<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>_>
* geometrycentral::surface::makeSurfaceMeshAndGeometry
            (tuple<std::unique_ptr<geometrycentral::surface::SurfaceMesh,_std::default_delete<geometrycentral::surface::SurfaceMesh>_>,_std::unique_ptr<geometrycentral::surface::VertexPositionGeometry,_std::default_delete<geometrycentral::surface::VertexPositionGeometry>_>,_std::unique_ptr<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>_>
             *__return_storage_ptr__,
            vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *polygons,
            vector<std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>_>_>
            *twins,vector<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_>
                   *vertexPositions,
            vector<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
            *paramCoordinates)

{
  undefined8 *puVar1;
  Vector2 *pVVar2;
  pointer pvVar3;
  pointer pvVar4;
  pointer pVVar5;
  Vector3 *pVVar6;
  long lVar7;
  unsigned_long uVar8;
  double dVar9;
  size_t i_1;
  _Head_base<0UL,_geometrycentral::surface::SurfaceMesh_*,_false> this;
  _Head_base<0UL,_geometrycentral::surface::VertexPositionGeometry_*,_false> this_00;
  __uniq_ptr_data<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>,_true,_true>
  this_01;
  size_t sVar10;
  pointer puVar11;
  pointer pvVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  unique_ptr<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>
  parameterization;
  RangeIteratorBase<geometrycentral::surface::VertexRangeF> __begin2;
  RangeIteratorBase<geometrycentral::surface::VertexRangeF> __end2;
  
  pvVar3 = (twins->
           super__Vector_base<std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar4 = (twins->
           super__Vector_base<std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  this._M_head_impl = (SurfaceMesh *)operator_new(0x308);
  if (pvVar3 == pvVar4) {
    SurfaceMesh::SurfaceMesh(this._M_head_impl,polygons);
  }
  else {
    SurfaceMesh::SurfaceMesh(this._M_head_impl,polygons,twins);
  }
  this_00._M_head_impl = (VertexPositionGeometry *)operator_new(0x1880);
  VertexPositionGeometry::VertexPositionGeometry(this_00._M_head_impl,this._M_head_impl);
  parameterization._M_t.
  super___uniq_ptr_impl<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_*,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>
  .
  super__Head_base<0UL,_geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>,_true,_true>
        )(__uniq_ptr_data<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>,_true,_true>
          )this._M_head_impl;
  RangeSetBase<geometrycentral::surface::VertexRangeF>::begin
            (&__begin2,(RangeSetBase<geometrycentral::surface::VertexRangeF> *)&parameterization);
  RangeSetBase<geometrycentral::surface::VertexRangeF>::end
            (&__end2,(RangeSetBase<geometrycentral::surface::VertexRangeF> *)&parameterization);
  while (__begin2.iCurr != __end2.iCurr) {
    pVVar5 = (vertexPositions->
             super__Vector_base<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pVVar6 = (((DATA_T *)((long)&(this_00._M_head_impl)->super_EmbeddedGeometryInterface + 0x1538))
             ->super_PlainObjectBase<Eigen::Matrix<geometrycentral::Vector3,__1,_1,_0,__1,_1>_>).
             m_storage.m_data;
    pVVar6[__begin2.iCurr].z = pVVar5[__begin2.iCurr].z;
    pVVar5 = pVVar5 + __begin2.iCurr;
    dVar9 = pVVar5->y;
    pVVar6 = pVVar6 + __begin2.iCurr;
    pVVar6->x = pVVar5->x;
    pVVar6->y = dVar9;
    RangeIteratorBase<geometrycentral::surface::VertexRangeF>::operator++(&__begin2);
  }
  this_01.
  super___uniq_ptr_impl<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_*,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>
  .
  super__Head_base<0UL,_geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_impl<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>
        )operator_new(0x40);
  MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>::MeshData
            ((MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2> *)
             this_01.
             super___uniq_ptr_impl<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_*,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>
             .
             super__Head_base<0UL,_geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_*,_false>
             ._M_head_impl,this._M_head_impl);
  pvVar12 = (paramCoordinates->
            super__Vector_base<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  sVar10 = ((long)(paramCoordinates->
                  super__Vector_base<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar12) / 0x18;
  if (sVar10 == (this._M_head_impl)->nFacesCount) {
    for (uVar13 = 0; uVar13 < sVar10; uVar13 = uVar13 + 1) {
      puVar11 = ((this._M_head_impl)->fHalfedgeArr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start + uVar13;
      lVar14 = 0;
      for (uVar15 = 0;
          lVar7 = *(long *)&pvVar12[uVar13].
                            super__Vector_base<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>
                            ._M_impl.super__Vector_impl_data,
          uVar15 < (ulong)((long)*(pointer *)
                                  ((long)&pvVar12[uVar13].
                                          super__Vector_base<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>
                                          ._M_impl.super__Vector_impl_data + 8) - lVar7 >> 4);
          uVar15 = uVar15 + 1) {
        puVar1 = (undefined8 *)(lVar7 + lVar14);
        dVar9 = (double)puVar1[1];
        uVar8 = *puVar11;
        lVar14 = lVar14 + 0x10;
        pVVar2 = (((DATA_T *)
                  ((long)this_01.
                         super___uniq_ptr_impl<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_*,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>
                         .
                         super__Head_base<0UL,_geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_*,_false>
                         ._M_head_impl + 0x18))->
                 super_PlainObjectBase<Eigen::Matrix<geometrycentral::Vector2,__1,_1,_0,__1,_1>_>).
                 m_storage.m_data + uVar8;
        pVVar2->x = (double)*puVar1;
        pVVar2->y = dVar9;
        puVar11 = ((this._M_head_impl)->heNextArr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start + uVar8;
        pvVar12 = (paramCoordinates->
                  super__Vector_base<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
      }
      sVar10 = (this._M_head_impl)->nFacesCount;
    }
  }
  parameterization._M_t.
  super___uniq_ptr_impl<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_*,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>
  .
  super__Head_base<0UL,_geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>,_true,_true>
        )(__uniq_ptr_impl<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>
          )0x0;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_std::unique_ptr<geometrycentral::surface::SurfaceMesh,_std::default_delete<geometrycentral::surface::SurfaceMesh>_>,_std::unique_ptr<geometrycentral::surface::VertexPositionGeometry,_std::default_delete<geometrycentral::surface::VertexPositionGeometry>_>,_std::unique_ptr<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>_>
  ).
  super__Tuple_impl<1UL,_std::unique_ptr<geometrycentral::surface::VertexPositionGeometry,_std::default_delete<geometrycentral::surface::VertexPositionGeometry>_>,_std::unique_ptr<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>_>
  .
  super__Tuple_impl<2UL,_std::unique_ptr<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>_>
  .
  super__Head_base<2UL,_std::unique_ptr<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>,_false>
  ._M_head_impl._M_t.
  super___uniq_ptr_impl<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>
       = this_01.
         super___uniq_ptr_impl<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_*,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>
         .
         super__Head_base<0UL,_geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_*,_false>
         ._M_head_impl;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_std::unique_ptr<geometrycentral::surface::SurfaceMesh,_std::default_delete<geometrycentral::surface::SurfaceMesh>_>,_std::unique_ptr<geometrycentral::surface::VertexPositionGeometry,_std::default_delete<geometrycentral::surface::VertexPositionGeometry>_>,_std::unique_ptr<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>_>
  ).
  super__Tuple_impl<1UL,_std::unique_ptr<geometrycentral::surface::VertexPositionGeometry,_std::default_delete<geometrycentral::surface::VertexPositionGeometry>_>,_std::unique_ptr<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>_>
  .
  super__Head_base<1UL,_std::unique_ptr<geometrycentral::surface::VertexPositionGeometry,_std::default_delete<geometrycentral::surface::VertexPositionGeometry>_>,_false>
  ._M_head_impl._M_t.
  super___uniq_ptr_impl<geometrycentral::surface::VertexPositionGeometry,_std::default_delete<geometrycentral::surface::VertexPositionGeometry>_>
  ._M_t.
  super__Tuple_impl<0UL,_geometrycentral::surface::VertexPositionGeometry_*,_std::default_delete<geometrycentral::surface::VertexPositionGeometry>_>
  .super__Head_base<0UL,_geometrycentral::surface::VertexPositionGeometry_*,_false>._M_head_impl =
       this_00._M_head_impl;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_std::unique_ptr<geometrycentral::surface::SurfaceMesh,_std::default_delete<geometrycentral::surface::SurfaceMesh>_>,_std::unique_ptr<geometrycentral::surface::VertexPositionGeometry,_std::default_delete<geometrycentral::surface::VertexPositionGeometry>_>,_std::unique_ptr<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>_>
  ).
  super__Head_base<0UL,_std::unique_ptr<geometrycentral::surface::SurfaceMesh,_std::default_delete<geometrycentral::surface::SurfaceMesh>_>,_false>
  ._M_head_impl._M_t.
  super___uniq_ptr_impl<geometrycentral::surface::SurfaceMesh,_std::default_delete<geometrycentral::surface::SurfaceMesh>_>
  ._M_t.
  super__Tuple_impl<0UL,_geometrycentral::surface::SurfaceMesh_*,_std::default_delete<geometrycentral::surface::SurfaceMesh>_>
  .super__Head_base<0UL,_geometrycentral::surface::SurfaceMesh_*,_false>._M_head_impl =
       this._M_head_impl;
  ::std::
  unique_ptr<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>
  ::~unique_ptr(&parameterization);
  return __return_storage_ptr__;
}

Assistant:

std::tuple<std::unique_ptr<SurfaceMesh>, std::unique_ptr<VertexPositionGeometry>, std::unique_ptr<CornerData<Vector2>>>
makeSurfaceMeshAndGeometry(const std::vector<std::vector<size_t>>& polygons,
                           const std::vector<std::vector<std::tuple<size_t, size_t>>>& twins,
                           const std::vector<Vector3> vertexPositions,
                           const std::vector<std::vector<Vector2>>& paramCoordinates) {

  // Construct
  std::unique_ptr<SurfaceMesh> mesh;
  if (twins.empty()) {
    mesh.reset(new SurfaceMesh(polygons));
  } else {
    mesh.reset(new SurfaceMesh(polygons, twins));
  }
  std::unique_ptr<VertexPositionGeometry> geometry(new VertexPositionGeometry(*mesh));
  for (Vertex v : mesh->vertices()) {
    // Use the low-level indexers here since we're constructing
    (*geometry).vertexPositions[v] = vertexPositions[v.getIndex()];
  }

  std::unique_ptr<CornerData<Vector2>> parameterization(new CornerData<Vector2>(*mesh));
  if (paramCoordinates.size() == mesh->nFaces()) {
    for (size_t i = 0; i < mesh->nFaces(); i++) {
      Halfedge h = mesh->face(i).halfedge();
      for (size_t j = 0; j < paramCoordinates[i].size(); j++) {
        (*parameterization)[h.corner()] = paramCoordinates[i][j];
        h = h.next();
      }
    }
  }

  return std::make_tuple(std::move(mesh), std::move(geometry), std::move(parameterization));
}